

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O1

int ParseInt(char *s,int low,int high,int *result)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000014;
  ulong uVar4;
  
  uVar4 = 0;
  iVar3 = 0;
  while( true ) {
    cVar1 = s[uVar4];
    if (cVar1 == '\0') {
      iVar2 = 2;
    }
    else {
      iVar2 = 1;
      if (0xf5 < (byte)(cVar1 - 0x3aU)) {
        iVar3 = (uint)(byte)(cVar1 - 0x30) + iVar3 * 10;
        iVar2 = 0;
      }
    }
    if (iVar2 != 0) break;
    uVar4 = uVar4 + 1;
    if (uVar4 == 5) {
      uVar4 = 5;
LAB_00104115:
      if ((int)uVar4 == 0) {
        return 0;
      }
      if (((((int)uVar4 == 1) || (*s != '0')) && (s[uVar4 & 0xffffffff] == '\0')) &&
         (iVar3 <= low && -1 < iVar3)) {
        *(int *)CONCAT44(in_register_00000014,high) = iVar3;
        return 1;
      }
      return 0;
    }
  }
  if (iVar2 != 2) {
    return 0;
  }
  goto LAB_00104115;
}

Assistant:

static BROTLI_BOOL ParseInt(const char* s, int low, int high, int* result) {
  int value = 0;
  int i;
  for (i = 0; i < 5; ++i) {
    char c = s[i];
    if (c == 0) break;
    if (s[i] < '0' || s[i] > '9') return BROTLI_FALSE;
    value = (10 * value) + (c - '0');
  }
  if (i == 0) return BROTLI_FALSE;
  if (i > 1 && s[0] == '0') return BROTLI_FALSE;
  if (s[i] != 0) return BROTLI_FALSE;
  if (value < low || value > high) return BROTLI_FALSE;
  *result = value;
  return BROTLI_TRUE;
}